

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Get_elements_x(MPIABI_Status *status,MPIABI_Datatype datatype,MPIABI_Count *count)

{
  int iVar1;
  MPI_Status *pMVar2;
  ompi_datatype_t *poVar3;
  WPI_Handle<ompi_datatype_t_*> local_40 [3];
  WPI_const_StatusPtr local_28;
  MPIABI_Count *local_20;
  MPIABI_Count *count_local;
  MPIABI_Datatype datatype_local;
  MPIABI_Status *status_local;
  
  local_20 = count;
  count_local = (MPIABI_Count *)datatype;
  datatype_local = (MPIABI_Datatype)status;
  WPI_const_StatusPtr::WPI_const_StatusPtr(&local_28,status);
  pMVar2 = WPI_const_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_28);
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(local_40,(uintptr_t)count_local);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)local_40);
  iVar1 = MPI_Get_elements_x(pMVar2,poVar3,local_20);
  WPI_const_StatusPtr::~WPI_const_StatusPtr(&local_28);
  return iVar1;
}

Assistant:

int MPIABI_Get_elements_x(
  const MPIABI_Status * status,
  MPIABI_Datatype datatype,
  MPIABI_Count * count
) {
  return MPI_Get_elements_x(
    (const MPI_Status *)(WPI_const_StatusPtr)status,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Count *)(WPI_Count *)count
  );
}